

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O0

size_t phyr::getL1CacheLineSize(void)

{
  undefined8 uVar1;
  ulong uVar2;
  _Ios_Iostate __a;
  failure *anon_var_0;
  size_t l1sz;
  char *cacheDataPath;
  fstream fs;
  ulong local_230;
  char *local_228;
  long local_210 [66];
  
  std::fstream::fstream(local_210);
  uVar1 = *(undefined8 *)(local_210[0] + -0x18);
  __a = std::ios::exceptions();
  std::operator|(__a,_S_failbit);
  std::ios::exceptions((int)local_210 + (int)uVar1);
  local_228 = "/sys/devices/system/cpu/cpu0/cache/index1/coherency_line_size";
  local_230 = 0x40;
  std::fstream::open((char *)local_210,0x10f0c8);
  std::istream::operator>>((istream *)local_210,&local_230);
  uVar2 = local_230;
  std::fstream::~fstream(local_210);
  return uVar2;
}

Assistant:

size_t getL1CacheLineSize() {
    std::fstream fs;
    // Set fstream to throw an exception in case of a failure
    fs.exceptions(fs.exceptions() | std::ios::failbit);

    // Data path for L1 cache (Unix systems)
    const char* cacheDataPath = "/sys/devices/system/cpu/cpu0"
                                "/cache/index1/coherency_line_size";

    size_t l1sz = DEF_PHYR_L1_CACHE_LINESZ;
    try {
        fs.open(cacheDataPath, std::fstream::in);
        fs >> l1sz;
    } catch (std::ios::failure&) {}

    return l1sz;
}